

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

void __thiscall
cppcms::impl::
io_handler_binder_p0<void_(cppcms::impl::tcp_cache_service::session::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
::io_handler_binder_p0
          (io_handler_binder_p0<void_(cppcms::impl::tcp_cache_service::session::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
           *this,offset_in_session_to_subr *f,
          shared_ptr<cppcms::impl::tcp_cache_service::session> *s)

{
  element_type *peVar1;
  undefined8 *in_RSI;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_RDI;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_ffffffffffffffd8;
  
  booster::callable<void_(const_std::error_code_&,_unsigned_long)>::callable
            ((callable<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI);
  (in_RDI->super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>)
  ._M_ptr = (element_type *)&PTR__io_handler_binder_p0_00530260;
  peVar1 = (element_type *)*in_RSI;
  in_RDI[1].super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RDI[1].super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  std::shared_ptr<cppcms::impl::tcp_cache_service::session>::shared_ptr
            (in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

io_handler_binder_p0(F const &f,S const &s) : f_(f), s_(s) {}